

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void encode_b_nonrd(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **tp,
                   int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PARTITION_TYPE partition,
                   PICK_MODE_CONTEXT *ctx,int *rate)

{
  MACROBLOCKD *xd;
  REFERENCE_MODE RVar1;
  ushort uVar2;
  int iVar3;
  int subsampling_x;
  int subsampling_y;
  MB_MODE_INFO *pMVar4;
  SequenceHeader *pSVar5;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_best;
  MV_REFERENCE_FRAME ref1;
  uint8_t ref_frame_type;
  uint uVar6;
  undefined4 uVar8;
  int *piVar7;
  
  av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  iVar3 = (td->mb).rdmult;
  uVar8 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  pMVar4 = *(td->mb).e_mbd.mi;
  pMVar4->partition = partition;
  piVar7 = (int *)CONCAT44(uVar8,(uint)dry_run);
  av1_update_state(cpi,td,ctx,mi_row,mi_col,bsize,dry_run);
  if (dry_run != 0) {
    encode_superblock(cpi,tile_data,td,tp,dry_run,bsize,piVar7);
    goto LAB_001d7f56;
  }
  pSVar5 = (cpi->common).seq_params;
  subsampling_x = pSVar5->subsampling_x;
  subsampling_y = pSVar5->subsampling_y;
  *(undefined4 *)((td->mb).mbmi_ext_frame)->cb_offset = *(undefined4 *)(td->mb).cb_offset;
  encode_superblock(cpi,tile_data,td,tp,'\0',bsize,piVar7);
  update_cb_offsets(&td->mb,bsize,subsampling_x,subsampling_y);
  uVar2 = *(ushort *)&pMVar4->field_0xa7;
  uVar6 = (uint)uVar2;
  if ('\0' < pMVar4->ref_frame[1]) {
    if (((uVar2 >> 9 & 1) == 0) || ((pMVar4->interinter_comp).type == '\0')) {
      uVar6 = uVar2 & 0xfeff;
    }
    else {
      uVar6 = uVar2 | 0x100;
    }
    uVar6 = uVar6 | 0x200;
    *(short *)&pMVar4->field_0xa7 = (short)uVar6;
  }
  xd = &(td->mb).e_mbd;
  if ((uVar6 & 0x40) == 0) {
    if ((((cpi->common).seg.enabled == '\0') ||
        (((cpi->common).seg.feature_mask[uVar6 & 7] & 0x20) == 0)) &&
       (((char)uVar6 < '\0' || ('\0' < pMVar4->ref_frame[0])))) {
      av1_collect_neighbors_ref_counts(xd);
      RVar1 = (cpi->common).current_frame.reference_mode;
      ref1 = pMVar4->ref_frame[1];
      goto joined_r0x001d7edf;
    }
  }
  else {
    (td->rd_counts).skip_mode_used_flag = 1;
    RVar1 = (cpi->common).current_frame.reference_mode;
    ref1 = pMVar4->ref_frame[1];
joined_r0x001d7edf:
    if ((RVar1 == '\x02') && ('\0' < ref1)) {
      (td->rd_counts).compound_ref_used_flag = 1;
      ref1 = pMVar4->ref_frame[1];
    }
    set_ref_ptrs(&cpi->common,xd,pMVar4->ref_frame[0],ref1);
  }
  if (((cpi->oxcf).algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY) &&
     (pMVar4->mode == 0x10 || pMVar4->mode < 0xd)) {
    piVar7 = &(td->rd_counts).newmv_or_intra_blocks;
    *piVar7 = *piVar7 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [bsize] *
                        (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [bsize];
  }
  if (tile_data->allow_update_cdf != '\0') {
    update_stats(&cpi->common,td);
  }
LAB_001d7f56:
  if (((((cpi->oxcf).q_cfg.aq_mode == '\x03') || ((cpi->active_map).enabled != 0)) &&
      (pMVar4->skip_txfm != '\0')) &&
     (((cpi->rc).rtc_external_ratectrl == 0 && ((cpi->common).seg.enabled != '\0')))) {
    av1_cyclic_reset_segment_skip(cpi,&td->mb,mi_row,mi_col,bsize,dry_run);
  }
  mbmi_ext_best = (td->mb).mbmi_ext_frame;
  ref_frame_type = av1_ref_frame_type((*(td->mb).e_mbd.mi)->ref_frame);
  av1_copy_mbmi_ext_to_mbmi_ext_frame(mbmi_ext_best,&(td->mb).mbmi_ext,ref_frame_type);
  (td->mb).rdmult = iVar3;
  return;
}

Assistant:

static void encode_b_nonrd(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                           ThreadData *td, TokenExtra **tp, int mi_row,
                           int mi_col, RUN_TYPE dry_run, BLOCK_SIZE bsize,
                           PARTITION_TYPE partition,
                           PICK_MODE_CONTEXT *const ctx, int *rate) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing((AV1_COMP *)cpi, encode_b_nonrd_time);
#endif
  const AV1_COMMON *const cm = &cpi->common;
  TileInfo *const tile = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);
  const int origin_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);
  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->partition = partition;
  av1_update_state(cpi, td, ctx, mi_row, mi_col, bsize, dry_run);
  const int subsampling_x = cpi->common.seq_params->subsampling_x;
  const int subsampling_y = cpi->common.seq_params->subsampling_y;
  if (!dry_run) {
    set_cb_offsets(x->mbmi_ext_frame->cb_offset, x->cb_offset[PLANE_TYPE_Y],
                   x->cb_offset[PLANE_TYPE_UV]);
    assert(x->cb_offset[PLANE_TYPE_Y] <
           (1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]));
    assert(x->cb_offset[PLANE_TYPE_UV] <
           ((1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]) >>
            (subsampling_x + subsampling_y)));
  }

  encode_superblock(cpi, tile_data, td, tp, dry_run, bsize, rate);
  if (!dry_run) {
    update_cb_offsets(x, bsize, subsampling_x, subsampling_y);
    if (has_second_ref(mbmi)) {
      if (mbmi->compound_idx == 0 ||
          mbmi->interinter_comp.type == COMPOUND_AVERAGE)
        mbmi->comp_group_idx = 0;
      else
        mbmi->comp_group_idx = 1;
      mbmi->compound_idx = 1;
    }
    RD_COUNTS *const rdc = &td->rd_counts;
    if (mbmi->skip_mode) {
      assert(!frame_is_intra_only(cm));
      rdc->skip_mode_used_flag = 1;
      if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT &&
          has_second_ref(mbmi)) {
        rdc->compound_ref_used_flag = 1;
      }
      set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    } else {
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active) {
        // If the segment reference feature is enabled we have only a single
        // reference frame allowed for the segment so exclude it from
        // the reference frame counts used to work out probabilities.
        if (is_inter_block(mbmi)) {
          av1_collect_neighbors_ref_counts(xd);
          if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT &&
              has_second_ref(mbmi)) {
            // This flag is also updated for 4x4 blocks
            rdc->compound_ref_used_flag = 1;
          }
          set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
        }
      }
    }
    if (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY &&
        (mbmi->mode == NEWMV || mbmi->mode < INTRA_MODE_END)) {
      int32_t blocks = mi_size_high[bsize] * mi_size_wide[bsize];
      rdc->newmv_or_intra_blocks += blocks;
    }
    if (tile_data->allow_update_cdf) update_stats(&cpi->common, td);
  }
  if ((cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ ||
       cpi->active_map.enabled) &&
      mbmi->skip_txfm && !cpi->rc.rtc_external_ratectrl && cm->seg.enabled)
    av1_cyclic_reset_segment_skip(cpi, x, mi_row, mi_col, bsize, dry_run);
  // TODO(Ravi/Remya): Move this copy function to a better logical place
  // This function will copy the best mode information from block
  // level (x->mbmi_ext) to frame level (cpi->mbmi_ext_info.frame_base). This
  // frame level buffer (cpi->mbmi_ext_info.frame_base) will be used during
  // bitstream preparation.
  av1_copy_mbmi_ext_to_mbmi_ext_frame(x->mbmi_ext_frame, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  x->rdmult = origin_mult;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing((AV1_COMP *)cpi, encode_b_nonrd_time);
#endif
}